

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Columns *cols)

{
  bool bVar1;
  bool bVar2;
  string line;
  iterator __end3;
  iterator __begin3;
  string local_a0;
  iterator local_80;
  iterator local_58;
  
  Columns::iterator::iterator(&local_58,cols);
  Columns::iterator::iterator(&local_80,cols);
  bVar2 = true;
  while( true ) {
    bVar1 = Columns::iterator::operator!=(&local_58,&local_80);
    if (!bVar1) break;
    Columns::iterator::operator*[abi_cxx11_(&local_a0,&local_58);
    if (!bVar2) {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\n",1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    bVar2 = false;
    Columns::iterator::operator++(&local_58);
  }
  if (local_80.m_iterators.
      super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_iterators.
                    super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.m_iterators.
      super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_iterators.
                    super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return os;
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Columns const& cols) {

		bool first = true;
		for (auto line : cols) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}